

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# full_gal_tests.cc
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
lf::uscalfe::test::
LinFEEnergyTest<lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_7_Test::TestBody()::__0>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_7_Test::TestBody()::__1>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_7_Test::TestBody()::__2>>
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,test *this,int reflevels,
          MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:181:7)>
          *v,MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:183:48)>
             *alpha,
          MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:188:7)>
          *gamma)

{
  element_type *this_00;
  size_type sVar1;
  ostream *poVar2;
  reference pvVar3;
  void *this_01;
  undefined4 in_register_00000014;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *in_stack_fffffffffffffec0;
  uint local_d8;
  int l;
  size_type L;
  shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> local_c0;
  shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>_> local_b0;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:188:7)>
  local_a0;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:188:7)>
  local_90;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:183:48)>
  local_80;
  undefined1 local_70 [32];
  shared_ptr<lf::mesh::Mesh> local_50;
  undefined1 local_40 [8];
  shared_ptr<lf::refinement::MeshHierarchy> multi_mesh_p;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:188:7)>
  *gamma_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:183:48)>
  *alpha_local;
  MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:181:7)>
  *v_local;
  int reflevels_local;
  vector<double,_std::allocator<double>_> *energies;
  
  multi_mesh_p.super___shared_ptr<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)alpha;
  lf::mesh::test_utils::GenerateHybrid2DTestMesh((test_utils *)&local_50,0,0.3333333333333333);
  refinement::GenerateMeshHierarchyByUniformRefinemnt
            ((refinement *)local_40,&local_50,(size_type)this,rp_regular);
  std::shared_ptr<lf::mesh::Mesh>::~shared_ptr(&local_50);
  local_70[0x13] = 0;
  this_00 = std::
            __shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<lf::refinement::MeshHierarchy,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_40);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:181:7)>
  ::MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:181:7)>
              *)local_70,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:181:7)>
              *)CONCAT44(in_register_00000014,reflevels));
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:183:48)>
  ::MeshFunctionGlobal
            (&local_80,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:183:48)>
              *)v);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:188:7)>
  ::MeshFunctionGlobal
            (&local_90,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:188:7)>
              *)alpha);
  std::make_shared<lf::uscalfe::FeLagrangeO1Tria<double>>();
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)&local_a0,&local_b0);
  std::make_shared<lf::uscalfe::FeLagrangeO1Quad<double>>();
  std::shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const>::
  shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>,void>
            ((shared_ptr<lf::fe::ScalarReferenceFiniteElement<double>const> *)&local_c0,
             (shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>_> *)&l);
  EnergiesOfInterpolants<double,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_7_Test::TestBody()::__0>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_7_Test::TestBody()::__1>,lf::mesh::utils::MeshFunctionGlobal<lf::uscalfe::test::lf_gfe_a_dir_dbg_7_Test::TestBody()::__2>>
            (__return_storage_ptr__,(test *)this_00,(MeshHierarchy *)local_70,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:181:7)>
              *)&local_80,
             (MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:183:48)>
              *)&local_90,&local_a0,&local_c0,in_stack_fffffffffffffec0);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr(&local_c0);
  std::shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>_>::~shared_ptr
            ((shared_ptr<lf::uscalfe::FeLagrangeO1Quad<double>_> *)&l);
  std::shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_>::~shared_ptr
            ((shared_ptr<const_lf::fe::ScalarReferenceFiniteElement<double>_> *)&local_a0);
  std::shared_ptr<lf::uscalfe::FeLagrangeO1Tria<double>_>::~shared_ptr(&local_b0);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:188:7)>
  ::~MeshFunctionGlobal(&local_90);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:183:48)>
  ::~MeshFunctionGlobal(&local_80);
  lf::mesh::utils::
  MeshFunctionGlobal<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/uscalfe/test/full_gal_tests.cc:181:7)>
  ::~MeshFunctionGlobal
            ((MeshFunctionGlobal<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_craffael[P]lehrfempp_lib_lf_uscalfe_test_full_gal_tests_cc:181:7)>
              *)local_70);
  sVar1 = std::vector<double,_std::allocator<double>_>::size(__return_storage_ptr__);
  for (local_d8 = 0; local_d8 < (uint)sVar1; local_d8 = local_d8 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Level");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_d8);
    poVar2 = std::operator<<(poVar2,": energy = ");
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)(int)local_d8);
    this_01 = (void *)std::ostream::operator<<(poVar2,*pvVar3);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  }
  local_70[0x13] = 1;
  std::shared_ptr<lf::refinement::MeshHierarchy>::~shared_ptr
            ((shared_ptr<lf::refinement::MeshHierarchy> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> LinFEEnergyTest(int reflevels, FFUNC v, DIFF_COEFF alpha,
                                    REAC_COEFF gamma) {
  // Generate hierarchy of meshes of the unit square
  std::shared_ptr<lf::refinement::MeshHierarchy> multi_mesh_p =
      lf::refinement::GenerateMeshHierarchyByUniformRefinemnt(
          lf::mesh::test_utils::GenerateHybrid2DTestMesh(0, 1.0 / 3),
          reflevels);
  // Compute energies of the pw. linear interpolants of v on the different
  // refinement levels
  std::vector<double> energies{EnergiesOfInterpolants<double>(
      *multi_mesh_p, v, alpha, gamma,
      std::make_shared<FeLagrangeO1Tria<double>>(),
      std::make_shared<FeLagrangeO1Quad<double>>())};
  size_type L = energies.size();
  for (int l = 0; l < L; ++l) {
    std::cout << "Level" << l << ": energy = " << energies[l] << std::endl;
  }
  return energies;
}